

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

void __thiscall QLocale::setNumberOptions(QLocale *this,NumberOptions options)

{
  QLocalePrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QLocalePrivate *)0x0) &&
     ((pQVar1->ref)._q_value.super___atomic_base<int>._M_i != 1)) {
    QSharedDataPointer<QLocalePrivate>::detach_helper(&this->d);
  }
  (((this->d).d.ptr)->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i =
       (Int)options.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
            super_QFlagsStorage<QLocale::NumberOption>.i;
  return;
}

Assistant:

void QLocale::setNumberOptions(NumberOptions options)
{
    d->m_numberOptions = options;
}